

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmon.cpp
# Opt level: O0

void __thiscall memmon::get_hardware_info(memmon *this,json *hw_json)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  byte bVar1;
  bool bVar2;
  int iVar3;
  key_type *key;
  ulong uVar4;
  ulong uVar5;
  string *psVar6;
  reference other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *metric;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  string val;
  size_t splitIdx;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  metrics;
  ifstream memInfoFile;
  string *in_stack_fffffffffffffb68;
  string *in_stack_fffffffffffffb70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffba0;
  flag_type __f;
  char *in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  match_flag_type in_stack_fffffffffffffbb4;
  char *in_stack_fffffffffffffbb8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffbc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc8;
  string *local_410;
  string local_3c8 [64];
  string local_388 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_368;
  string local_350 [32];
  reference local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_320;
  undefined1 *local_318;
  string local_310 [32];
  string local_2f0 [32];
  long local_2d0;
  string local_2c8 [38];
  undefined1 local_2a2;
  allocator local_2a1;
  string *local_2a0;
  string local_298 [32];
  string *local_278;
  undefined8 local_270;
  undefined1 local_268 [24];
  undefined4 local_250;
  allocator local_249;
  string local_248 [48];
  istream local_218 [536];
  
  std::ifstream::ifstream(local_218,"/proc/meminfo",_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_248,"Failed to open /proc/meminfo",&local_249);
    MessageBase::error((MessageBase *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    local_250 = 1;
  }
  else {
    local_2a2 = 1;
    local_2a0 = local_298;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,"MemTotal",&local_2a1);
    local_2a2 = 0;
    local_278 = local_298;
    local_270 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x35a965);
    __l._M_len._0_4_ = in_stack_fffffffffffffbb0;
    __l._M_array = (iterator)in_stack_fffffffffffffba8;
    __l._M_len._4_4_ = in_stack_fffffffffffffbb4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(in_stack_fffffffffffffba0,__l,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x35a999);
    local_410 = (string *)&local_278;
    do {
      local_410 = local_410 + -0x20;
      std::__cxx11::string::~string(local_410);
    } while (local_410 != local_298);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    std::__cxx11::string::string(local_2c8);
    while( true ) {
      key = (key_type *)
            std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_2c8);
      bVar2 = std::ios::operator_cast_to_bool
                        ((ios *)(&key->_M_dataplus + *(long *)(*(long *)key + -0x18)));
      if (!bVar2) break;
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        local_2d0 = std::__cxx11::string::find((char *)local_2c8,0x366051);
        std::__cxx11::string::string(local_2f0);
        if (local_2d0 == -1) {
LAB_0035af0f:
          local_250 = 0;
        }
        else {
          std::__cxx11::string::substr((ulong)local_310,(ulong)local_2c8);
          std::__cxx11::string::operator=(local_2f0,local_310);
          std::__cxx11::string::~string(local_310);
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            local_318 = local_268;
            local_320._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)in_stack_fffffffffffffb68);
            local_328 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffffb68);
            while (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffffb70,
                                      (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)in_stack_fffffffffffffb68), bVar2) {
              local_330 = __gnu_cxx::
                          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator*(&local_320);
              uVar4 = std::__cxx11::string::size();
              uVar5 = std::__cxx11::string::size();
              if (uVar5 <= uVar4) {
                psVar6 = (string *)std::__cxx11::string::size();
                __f = (flag_type)(uVar4 >> 0x20);
                iVar3 = std::__cxx11::string::compare((ulong)local_2c8,0,psVar6);
                if (iVar3 == 0) {
                  std::__cxx11::string::size();
                  std::__cxx11::string::substr((ulong)local_350,(ulong)local_2f0);
                  std::__cxx11::string::operator=(local_2f0,local_350);
                  std::__cxx11::string::~string(local_350);
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                             CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                             in_stack_fffffffffffffba8,__f);
                  std::
                  regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
                            (in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,
                             in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4);
                  in_stack_fffffffffffffb80 =
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)std::__cxx11::stol(in_stack_fffffffffffffb70,
                                             (size_t *)in_stack_fffffffffffffb68,0);
                  local_368 = in_stack_fffffffffffffb80;
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::basic_json<long,_long,_0>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)in_stack_fffffffffffffb70,(long *)in_stack_fffffffffffffb68);
                  other = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          ::operator[]<char_const>
                                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
                  in_stack_fffffffffffffb70 =
                       (string *)
                       nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       ::operator[]<char_const>
                                 ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
                  std::__cxx11::string::string(local_3c8,(string *)local_330);
                  in_stack_fffffffffffffb68 =
                       (string *)
                       nlohmann::json_abi_v3_11_3::
                       basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                       ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                     *)local_410,key);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                               *)in_stack_fffffffffffffb80,other);
                  std::__cxx11::string::~string(local_3c8);
                  nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                 *)in_stack_fffffffffffffb70);
                  std::__cxx11::string::~string(local_388);
                  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                             in_stack_fffffffffffffb70);
                }
              }
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_320);
            }
            goto LAB_0035af0f;
          }
          local_250 = 2;
        }
        std::__cxx11::string::~string(local_2f0);
      }
    }
    std::ifstream::close();
    local_250 = 1;
    std::__cxx11::string::~string(local_2c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffb80);
  }
  std::ifstream::~ifstream(local_218);
  return;
}

Assistant:

void const memmon::get_hardware_info(nlohmann::json& hw_json) {
  // Read some information from /proc/meminfo
  std::ifstream memInfoFile{"/proc/meminfo"};
  if (!memInfoFile.is_open()) {
    error("Failed to open /proc/meminfo");
    return;
  }

  // Metrics to read from the input
  std::vector<std::string> metrics{"MemTotal"};

  // Loop over the file
  std::string line;
  while (std::getline(memInfoFile, line)) {
    if (line.empty()) continue;
    size_t splitIdx = line.find(":");
    std::string val;
    if (splitIdx != std::string::npos) {
      val = line.substr(splitIdx + 1);
      if (val.empty()) continue;
      for (const auto& metric : metrics) {
        if (line.size() >= metric.size() &&
            line.compare(0, metric.size(), metric) == 0) {
          val = val.substr(0, val.size() - 3);  // strip the trailing kB
          hw_json["HW"]["mem"][metric] =
              std::stol(std::regex_replace(val, std::regex("^\\s+|\\s+$"), ""));
        }  // end of metric check
      }    // end of populating metrics
    }      // end of seperator check
  }        // end of reading memInfoFile

  // Close the file
  memInfoFile.close();

  return;
}